

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O1

size_t picnic_signature_size(picnic_params_t param)

{
  picnic_instance_t *ppVar1;
  size_t sVar2;
  
  ppVar1 = picnic_instance_get(param);
  if ((ppVar1 == (picnic_instance_t *)0x0) || (0xb < param - Picnic_L1_FS)) {
    sVar2 = 0;
  }
  else {
    sVar2 = *(size_t *)(&DAT_0017c778 + (ulong)(param - Picnic_L1_FS) * 8);
  }
  return sVar2;
}

Assistant:

size_t PICNIC_CALLING_CONVENTION picnic_signature_size(picnic_params_t param) {
  if (!picnic_instance_get(param)) {
    return 0;
  }

  switch (param) {
  case Picnic_L1_FS:
    return PICNIC_SIGNATURE_SIZE_Picnic_L1_FS;
  case Picnic_L1_UR:
    return PICNIC_SIGNATURE_SIZE_Picnic_L1_UR;
  case Picnic_L1_full:
    return PICNIC_SIGNATURE_SIZE_Picnic_L1_full;
  case Picnic3_L1:
    return PICNIC_SIGNATURE_SIZE_Picnic3_L1;
  case Picnic_L3_FS:
    return PICNIC_SIGNATURE_SIZE_Picnic_L3_FS;
  case Picnic_L3_UR:
    return PICNIC_SIGNATURE_SIZE_Picnic_L3_UR;
  case Picnic_L3_full:
    return PICNIC_SIGNATURE_SIZE_Picnic_L3_full;
  case Picnic3_L3:
    return PICNIC_SIGNATURE_SIZE_Picnic3_L3;
  case Picnic_L5_FS:
    return PICNIC_SIGNATURE_SIZE_Picnic_L5_FS;
  case Picnic_L5_UR:
    return PICNIC_SIGNATURE_SIZE_Picnic_L5_UR;
  case Picnic_L5_full:
    return PICNIC_SIGNATURE_SIZE_Picnic_L5_full;
  case Picnic3_L5:
    return PICNIC_SIGNATURE_SIZE_Picnic3_L5;
  default:
    /* this should never happen */
    return 0;
  }
}